

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomModel::InternalSwap(CustomModel *this,CustomModel *other)

{
  CustomModel *other_local;
  CustomModel *this_local;
  
  google::protobuf::internal::
  MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::Swap(&this->parameters_,&other->parameters_);
  std::swap<std::__cxx11::string*>(&(this->classname_).ptr_,&(other->classname_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->description_).ptr_,&(other->description_).ptr_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void CustomModel::InternalSwap(CustomModel* other) {
  parameters_.Swap(&other->parameters_);
  classname_.Swap(&other->classname_);
  description_.Swap(&other->description_);
  std::swap(_cached_size_, other->_cached_size_);
}